

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

value_type * __thiscall
wasm::Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Random *this,vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *vec)

{
  pointer ppEVar1;
  pointer ppEVar2;
  uint32_t uVar3;
  
  ppEVar1 = (vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar1 != ppEVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)ppEVar2 - (long)ppEVar1) >> 3));
    return (vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
           _M_impl.super__Vector_impl_data._M_start + uVar3;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::Expression *>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }